

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinSerializer<std::tuple<int,bool,char,std::vector<int,std::allocator<int>>>,void>::
     serialize_elems<OutputStream,0ul,1ul,2ul,3ul>
               (vector<int,_std::allocator<int>_> *t,OutputStream *ostream)

{
  serialize<int,OutputStream>
            ((int *)((long)&t[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 4),ostream);
  serialize<bool,OutputStream>
            ((bool *)((long)&t[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + 1),ostream);
  serialize<char,OutputStream>((char *)(t + 1),ostream);
  BuiltinSerializer<std::vector<int,_std::allocator<int>_>,_void>::serialize<OutputStream>
            (t,ostream);
  return;
}

Assistant:

static void serialize_elems(const Tuple<E...>& t, OutputStream& ostream, std::index_sequence<I...>)
  {
    using swallow = int[];
    using std::get;
    (void)swallow{1, (mserialize::serialize(get<I>(t), ostream), int{})...};
  }